

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::dragLeaveEvent(QWidgetTextControlPrivate *this)

{
  QWidgetTextControl *this_00;
  undefined8 uVar1;
  long in_FS_OFFSET;
  undefined8 local_50;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  local_48.w._0_4_ = 0xffffffff;
  local_48.w._4_4_ = 0xffffffff;
  local_48.h._0_4_ = 0xffffffff;
  local_48.h._4_4_ = 0xffffffff;
  local_48.xp._0_4_ = 0xffffffff;
  local_48.xp._4_4_ = 0xffffffff;
  local_48.yp._0_4_ = 0xffffffff;
  local_48.yp._4_4_ = 0xffffffff;
  QWidgetTextControl::cursorRect(&local_48,this_00,&this->dndFeedbackCursor);
  QTextCursor::QTextCursor((QTextCursor *)&local_50);
  uVar1 = *(undefined8 *)&this->dndFeedbackCursor;
  *(undefined8 *)&this->dndFeedbackCursor = local_50;
  local_50 = uVar1;
  QTextCursor::~QTextCursor((QTextCursor *)&local_50);
  if ((0.0 < (double)CONCAT44(local_48.w._4_4_,local_48.w._0_4_)) &&
     (0.0 < (double)CONCAT44(local_48.h._4_4_,local_48.h._0_4_))) {
    QWidgetTextControl::updateRequest(this_00,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::dragLeaveEvent()
{
    Q_Q(QWidgetTextControl);

    const QRectF crect = q->cursorRect(dndFeedbackCursor);
    dndFeedbackCursor = QTextCursor();

    if (crect.isValid())
        emit q->updateRequest(crect);
}